

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O2

void __thiscall
soplex::SoPlexBase<double>::_storeBasisAsOldBasis
          (SoPlexBase<double> *this,DataArray<soplex::SPxSolverBase<double>::VarStatus> *rows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cols)

{
  int iVar1;
  Verbosity VVar2;
  SPxOut *pSVar3;
  Verbosity old_verbosity;
  
  iVar1 = this->_certificateMode;
  if (iVar1 == 2) {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      pSVar3 = soplex::operator<<(&this->spxout,
                                  "Store basis as old basis (from solver - testing unboundedness)");
      soplex::operator<<(pSVar3,"\n");
      (this->spxout).m_verbosity = VVar2;
    }
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
              (&this->_oldUnbdBasisStatusRows,rows);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
              (&this->_oldUnbdBasisStatusCols,cols);
    this->_hasOldUnbdBasis = true;
  }
  else if (iVar1 == 1) {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      pSVar3 = soplex::operator<<(&this->spxout,
                                  "Store basis as old basis (from solver - testing feasibility)");
      soplex::operator<<(pSVar3,"\n");
      (this->spxout).m_verbosity = VVar2;
    }
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
              (&this->_oldFeasBasisStatusRows,rows);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=
              (&this->_oldFeasBasisStatusCols,cols);
    this->_hasOldFeasBasis = true;
  }
  else if (iVar1 == 0) {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      pSVar3 = soplex::operator<<(&this->spxout,"Store basis as old basis (from solver)");
      soplex::operator<<(pSVar3,"\n");
      (this->spxout).m_verbosity = VVar2;
    }
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=(&this->_oldBasisStatusRows,rows);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator=(&this->_oldBasisStatusCols,cols);
    this->_hasOldBasis = true;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_storeBasisAsOldBasis(DataArray< typename SPxSolverBase<R>::VarStatus >& rows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& cols)
{
   if(_inStandardMode())
   {
      SPX_MSG_INFO1(spxout, spxout << "Store basis as old basis (from solver)" << "\n");
      _oldBasisStatusRows = rows;
      _oldBasisStatusCols = cols;
      _hasOldBasis = true;
   }
   else if(_inFeasMode())
   {
      SPX_MSG_INFO1(spxout, spxout << "Store basis as old basis (from solver - testing feasibility)" <<
                    "\n");
      _oldFeasBasisStatusRows = rows;
      _oldFeasBasisStatusCols = cols;
      _hasOldFeasBasis = true;
   }
   else if(_inUnbdMode())
   {
      SPX_MSG_INFO1(spxout, spxout << "Store basis as old basis (from solver - testing unboundedness)" <<
                    "\n");
      _oldUnbdBasisStatusRows = rows;
      _oldUnbdBasisStatusCols = cols;
      _hasOldUnbdBasis = true;
   }
}